

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::ReadBDSEph(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uchar *Message;
  ulong uVar4;
  double dVar5;
  unsigned_short prn;
  char *buff;
  uchar *HeadBuff_local;
  BUFF *socketdata_local;
  ReadData *this_local;
  
  if ((this->Head).MessageID == 0x6a0) {
    uVar4 = (ulong)((this->Head).MessageLength + 4);
    if ((long)uVar4 < 0) {
      uVar4 = 0xffffffffffffffff;
    }
    Message = (uchar *)operator_new__(uVar4);
    if (socketdata->len - socketdata->pos < (this->Head).MessageLength) {
      socketdata->pos = socketdata->pos + -0x1c;
      this_local._4_4_ = 2;
    }
    else {
      memcpy(Message,socketdata->buff + socketdata->pos,(long)((this->Head).MessageLength + 4));
      socketdata->pos = (this->Head).MessageLength + 4 + socketdata->pos;
      bVar1 = CRCCheck(HeadBuff,Message,(this->Head).MessageLength,0xc4);
      if (bVar1) {
        iVar3 = U2I(Message,4);
        uVar2 = (unsigned_short)iVar3 - 1;
        if (uVar2 < 0x41) {
          this->BDSEph[uVar2].PRN = (unsigned_short)iVar3;
          this->BDSEph[uVar2].sys = BDS;
          iVar3 = U2I(Message + 4,4);
          this->BDSEph[uVar2].RefTime.Week = iVar3;
          dVar5 = C2D((char *)(Message + 8),8);
          this->BDSEph[uVar2].URA = dVar5;
          iVar3 = U2I(Message + 0x10,4);
          this->BDSEph[uVar2].HealthStatus = iVar3;
          dVar5 = C2D((char *)(Message + 0x14),8);
          this->BDSEph[uVar2].tgd = dVar5;
          dVar5 = C2D((char *)(Message + 0x1c),8);
          this->BDSEph[uVar2].tgd2 = dVar5;
          iVar3 = U2I(Message + 0x28,4);
          this->BDSEph[uVar2].toc = (double)iVar3;
          dVar5 = C2D((char *)(Message + 0x2c),8);
          this->BDSEph[uVar2].af0 = dVar5;
          dVar5 = C2D((char *)(Message + 0x34),8);
          this->BDSEph[uVar2].af1 = dVar5;
          dVar5 = C2D((char *)(Message + 0x3c),8);
          this->BDSEph[uVar2].af2 = dVar5;
          iVar3 = U2I(Message + 0x48,4);
          this->BDSEph[uVar2].RefTime.SOW = (double)iVar3;
          dVar5 = C2D((char *)(Message + 0x54),8);
          this->BDSEph[uVar2].ecc = dVar5;
          dVar5 = C2D((char *)(Message + 0x5c),8);
          this->BDSEph[uVar2].w = dVar5;
          dVar5 = C2D((char *)(Message + 0x4c),8);
          this->BDSEph[uVar2].sqrtA = dVar5;
          dVar5 = C2D((char *)(Message + 100),8);
          this->BDSEph[uVar2].deltaN = dVar5;
          dVar5 = C2D((char *)(Message + 0x6c),8);
          this->BDSEph[uVar2].M0 = dVar5;
          dVar5 = C2D((char *)(Message + 0x74),8);
          this->BDSEph[uVar2].omegaO = dVar5;
          dVar5 = C2D((char *)(Message + 0x7c),8);
          this->BDSEph[uVar2].omegaORate = dVar5;
          dVar5 = C2D((char *)(Message + 0x84),8);
          this->BDSEph[uVar2].I0 = dVar5;
          dVar5 = C2D((char *)(Message + 0x8c),8);
          this->BDSEph[uVar2].I0Rate = dVar5;
          dVar5 = C2D((char *)(Message + 0x94),8);
          this->BDSEph[uVar2].cuc = dVar5;
          dVar5 = C2D((char *)(Message + 0x9c),8);
          this->BDSEph[uVar2].cus = dVar5;
          dVar5 = C2D((char *)(Message + 0xa4),8);
          this->BDSEph[uVar2].crc = dVar5;
          dVar5 = C2D((char *)(Message + 0xac),8);
          this->BDSEph[uVar2].crs = dVar5;
          dVar5 = C2D((char *)(Message + 0xb4),8);
          this->BDSEph[uVar2].cic = dVar5;
          dVar5 = C2D((char *)(Message + 0xbc),8);
          this->BDSEph[uVar2].cis = dVar5;
          if (Message != (uchar *)0x0) {
            operator_delete__(Message);
          }
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 4;
        }
      }
      else {
        if (Message != (uchar *)0x0) {
          operator_delete__(Message);
        }
        this_local._4_4_ = 3;
      }
    }
  }
  else {
    this_local._4_4_ = 6;
  }
  return this_local._4_4_;
}

Assistant:

int ReadData::ReadBDSEph(BUFF &socketdata, unsigned char* HeadBuff) {
    if(Head.MessageID != 1696)
        return CONFLICT_ID;
    
    char* buff = new char [Head.MessageLength + 4];
    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        // reset(socketdata, pos);
        return FILE_OR_BUFF_END;
    }
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, 196)) {
        delete[] buff;
        return CRC_FAILED;
    }
    // cout << "BDS   " << endl;
    try
    {
        unsigned short int prn = U2I((unsigned char*)buff, 4) - 1;
        // cout << prn << endl;
        if(prn < 0 || prn > MAXBDSSRN)
            return INVALID_PRN;
        this->BDSEph[prn].PRN = prn + 1;
        this->BDSEph[prn].sys = BDS;

        this->BDSEph[prn].RefTime.Week = U2I((unsigned char*)(buff + 4), 4);
        this->BDSEph[prn].URA = C2D(buff + 8, 8);
        this->BDSEph[prn].HealthStatus = U2I((unsigned char*)(buff + 16), 4);
        this->BDSEph[prn].tgd = C2D(buff + 20, 8);
        this->BDSEph[prn].tgd2 = C2D(buff + 28, 8);
        this->BDSEph[prn].toc = U2I((unsigned char*)(buff + 40), 4);
        this->BDSEph[prn].af0 = C2D(buff + 44, 8);
        this->BDSEph[prn].af1 = C2D(buff + 52, 8);
        this->BDSEph[prn].af2 = C2D(buff + 60, 8);
        this->BDSEph[prn].RefTime.SOW = U2I((unsigned char*)(buff + 72), 4);
        this->BDSEph[prn].ecc = C2D((buff + 84), 8);
        this->BDSEph[prn].w = C2D(buff + 92, 8);
        this->BDSEph[prn].sqrtA = C2D(buff + 76, 8);
        this->BDSEph[prn].deltaN = C2D(buff + 100, 8);
        this->BDSEph[prn].M0 = C2D(buff + 108, 8);
        this->BDSEph[prn].omegaO = C2D(buff + 116, 8);
        this->BDSEph[prn].omegaORate = C2D(buff + 124, 8);
        this->BDSEph[prn].I0 = C2D(buff + 132, 8);
        this->BDSEph[prn].I0Rate = C2D(buff + 140, 8);
        this->BDSEph[prn].cuc = C2D(buff + 148, 8);
        this->BDSEph[prn].cus = C2D(buff + 156, 8);
        this->BDSEph[prn].crc = C2D(buff + 164, 8);
        this->BDSEph[prn].crs = C2D(buff + 172, 8);
        this->BDSEph[prn].cic = C2D(buff + 180, 8);
        this->BDSEph[prn].cis = C2D(buff + 188, 8);
        // cout << BDSEph[prn].sqrtA << endl;
    }
    catch(...)
    {
        cout << "error happened when reading bds eph" << endl;
        return UNSUPPORTED_MSG;
    }
    delete[] buff;
    return 0;
}